

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O2

void pbrt::writeObject(SP *object,affine3f *instanceXfm)

{
  element_type *peVar1;
  __shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ostream *poVar4;
  __shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  shared_ptr<pbrt::Shape> shape;
  SP mesh;
  __shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2> local_80;
  affine3f local_70;
  __shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"writing ");
  (**(((object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Entity)
     ._vptr_Entity)(&local_70);
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_70);
  peVar1 = (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = &((peVar1->shapes).
             super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var6 = &((peVar1->shapes).
                  super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>; p_Var6 != p_Var2;
      p_Var6 = p_Var6 + 1) {
    std::__shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>,p_Var6);
    std::dynamic_pointer_cast<pbrt::TriangleMesh,pbrt::Shape>
              ((shared_ptr<pbrt::Shape> *)
               &mesh.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>);
    if (mesh.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout," - warning: shape is not a triangle mesh : ");
      (**((shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Entity).
         _vptr_Entity)(&local_70);
      poVar4 = std::operator<<(poVar4,(string *)&local_70);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout," - found mesh w/ ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," tris");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,&mesh.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)
      ;
      writeTriangleMesh((SP *)&local_80,instanceXfm);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mesh.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  peVar1 = (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = &((peVar1->instances).
             super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var5 = &((peVar1->instances).
                  super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>; p_Var5 != p_Var3;
      p_Var5 = p_Var5 + 1) {
    std::__shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *)&shape,p_Var5);
    std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)
               &(shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->material
              );
    math::operator*(&local_70,instanceXfm,
                    (affine3f *)
                    &(shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     reverseOrientation);
    writeObject((SP *)&local_40,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void writeObject(Object::SP object, 
                   const affine3f &instanceXfm)
  {
    cout << "writing " << object->toString() << endl;
    for (auto shape : object->shapes) {
      TriangleMesh::SP mesh = std::dynamic_pointer_cast<TriangleMesh>(shape);
      if (mesh) {
        std::cout << " - found mesh w/ " << mesh->index.size() << " tris" << std::endl;
        writeTriangleMesh(mesh,instanceXfm);
      } else
        std::cout << " - warning: shape is not a triangle mesh : " << shape->toString() << std::endl;
    }
      
    for (auto inst : object->instances) {
      writeObject(inst->object,
                  instanceXfm*inst->xfm);
    }
  }